

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

void __thiscall game::undoMove(game *this)

{
  long lVar1;
  _Elt_pointer pbVar2;
  game *pgVar3;
  
  pbVar2 = (this->boardHistory).c.super__Deque_base<bitboards,_std::allocator<bitboards>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pbVar2 == (this->boardHistory).c.super__Deque_base<bitboards,_std::allocator<bitboards>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar2 = (this->boardHistory).c.super__Deque_base<bitboards,_std::allocator<bitboards>_>._M_impl
             .super__Deque_impl_data._M_finish._M_node[-1] + 4;
  }
  pbVar2 = pbVar2 + -1;
  pgVar3 = this;
  for (lVar1 = 100; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(char *)&(pgVar3->boards).WP = (char)pbVar2->WP;
    pbVar2 = (_Elt_pointer)((long)&pbVar2->WP + 1);
    pgVar3 = (game *)((long)&(pgVar3->boards).WP + 1);
  }
  std::deque<bitboards,_std::allocator<bitboards>_>::pop_back(&(this->boardHistory).c);
  std::deque<move,_std::allocator<move>_>::pop_back(&(this->history).c);
  this->blacksTurn = (bool)(this->blacksTurn ^ 1);
  return;
}

Assistant:

void game::undoMove() {
    boards = boardHistory.top();
    boardHistory.pop();
    history.pop();
    blacksTurn = !blacksTurn;
}